

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::pack_alpha_selectors
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  ulong uVar1;
  uchar *puVar2;
  undefined8 uVar3;
  uint i;
  ulong uVar4;
  ulong uVar5;
  uint64 i_2;
  long lVar6;
  vector<unsigned_long_long> remapped_selectors;
  symbol_histogram hist;
  static_huffman_data_model dm;
  symbol_codec local_c8;
  
  vector<unsigned_long_long>::vector(&remapped_selectors,(this->m_alpha_selectors).m_size);
  for (uVar4 = 0; uVar4 < (this->m_alpha_selectors).m_size; uVar4 = uVar4 + 1) {
    remapped_selectors.m_p[remapping->m_p[uVar4]] = (this->m_alpha_selectors).m_p[uVar4];
  }
  vector<unsigned_int>::vector(&hist.m_hist,0x40);
  uVar4 = 0;
  for (uVar5 = 0; uVar5 < remapped_selectors.m_size; uVar5 = uVar5 + 1) {
    uVar1 = remapped_selectors.m_p[uVar5];
    uVar4 = uVar4 ^ uVar1;
    for (lVar6 = -8; lVar6 != 0; lVar6 = lVar6 + 1) {
      hist.m_hist.m_p[(uint)uVar4 & 0x3f] = hist.m_hist.m_p[(uint)uVar4 & 0x3f] + 1;
      uVar4 = uVar4 >> 6;
    }
    uVar4 = uVar1;
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,&dm,false,(static_huffman_data_model *)0x0);
  uVar4 = 0;
  for (uVar5 = 0; uVar5 < remapped_selectors.m_size; uVar5 = uVar5 + 1) {
    uVar1 = remapped_selectors.m_p[uVar5];
    uVar4 = uVar4 ^ uVar1;
    for (lVar6 = -8; lVar6 != 0; lVar6 = lVar6 + 1) {
      symbol_codec::encode(&local_c8,(uint)uVar4 & 0x3f,&dm);
      uVar4 = uVar4 >> 6;
    }
    uVar4 = uVar1;
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar2 = packed_data->m_p;
  packed_data->m_p = local_c8.m_output_buf.m_p;
  uVar3._0_4_ = packed_data->m_size;
  uVar3._4_4_ = packed_data->m_capacity;
  packed_data->m_size = local_c8.m_output_buf.m_size;
  packed_data->m_capacity = local_c8.m_output_buf.m_capacity;
  local_c8.m_output_buf.m_p = puVar2;
  local_c8.m_output_buf._8_8_ = uVar3;
  symbol_codec::~symbol_codec(&local_c8);
  static_huffman_data_model::~static_huffman_data_model(&dm);
  vector<unsigned_int>::~vector(&hist.m_hist);
  vector<unsigned_long_long>::~vector(&remapped_selectors);
  return true;
}

Assistant:

bool crn_comp::pack_alpha_selectors(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping) {
  crnlib::vector<uint64> remapped_selectors(m_alpha_selectors.size());
  for (uint i = 0; i < m_alpha_selectors.size(); i++)
    remapped_selectors[remapping[i]] = m_alpha_selectors[i];
  symbol_histogram hist(64);
  for (uint64 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++) {
    for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 6)
      hist.inc_freq(selector & 0x3F);
  }
  static_huffman_data_model dm;
  dm.init(true, hist, 15);
  symbol_codec codec;
  codec.start_encoding(1024 * 1024);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  for (uint64 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++) {
    for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 6)
      codec.encode(selector & 0x3F, dm);
  }
  codec.stop_encoding(false);
  packed_data.swap(codec.get_encoding_buf());
  return true;
}